

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Cec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Gia_Man_t *p;
  int iVar5;
  int iVar6;
  char *pcVar7;
  FILE *pFVar8;
  Gia_Man_t *pGVar9;
  Gia_Man_t *pInit;
  long lVar10;
  char *pcVar11;
  Cec_ParCec_t ParsCec;
  Gia_Man_t *pGias [2];
  char *local_48 [3];
  
  pGias[0] = (Gia_Man_t *)0x0;
  pGias[1] = (Gia_Man_t *)0x0;
  Cec_ManCecSetDefaultParams(&ParsCec);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar4 = false;
LAB_0024f013:
  do {
    iVar5 = Extra_UtilGetopt(argc,argv,"CTnmdasvh");
    iVar6 = globalUtilOptind;
    switch(iVar5) {
    case 0x6d:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_0024f013;
    case 0x6e:
      ParsCec.fNaive = ParsCec.fNaive ^ 1;
      goto LAB_0024f013;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
      goto switchD_0024f04a_caseD_6f;
    case 0x73:
      ParsCec.fSilent = ParsCec.fSilent ^ 1;
      goto LAB_0024f013;
    case 0x76:
      ParsCec.fVerbose = ParsCec.fVerbose ^ 1;
      goto LAB_0024f013;
    }
    if (iVar5 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar11 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0024f0fb:
        Abc_Print(-1,pcVar11);
        goto switchD_0024f04a_caseD_6f;
      }
      iVar5 = atoi(argv[globalUtilOptind]);
      ParsCec.nBTLimit = iVar5;
    }
    else {
      if (iVar5 != 0x54) {
        if (iVar5 == 0x61) {
          bVar4 = (bool)(bVar4 ^ 1);
        }
        else {
          if (iVar5 != 100) {
            if (iVar5 == -1) {
              if (bVar2) {
                pGVar9 = pAbc->pGia;
                if (argc == globalUtilOptind && pGVar9 != (Gia_Man_t *)0x0) {
                  if (!bVar3) {
                    if (ParsCec.fSilent == 0) {
                      Abc_Print(1,"Assuming the current network is a single-output miter.\n");
                      pGVar9 = pAbc->pGia;
                    }
                    pGVar9 = Gia_ManDemiterToDual(pGVar9);
                    iVar6 = Cec_ManVerify(pGVar9,&ParsCec);
                    pAbc->Status = iVar6;
                    pAVar1 = pAbc->pGia->pCexComb;
                    pAbc->pGia->pCexComb = pGVar9->pCexComb;
                    pGVar9->pCexComb = pAVar1;
                    Gia_ManStop(pGVar9);
LAB_0024f39b:
                    Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
                    return 0;
                  }
                  if ((pGVar9->vCos->nSize - pGVar9->nRegs & 1U) == 0) {
                    if (ParsCec.fSilent == 0) {
                      Abc_Print(1,"Assuming the current network is a double-output miter.\n");
                      pGVar9 = pAbc->pGia;
                    }
                    iVar6 = Cec_ManVerify(pGVar9,&ParsCec);
                    pAbc->Status = iVar6;
                    goto LAB_0024f39b;
                  }
                  pcVar11 = "The dual-output miter should have an even number of outputs.\n";
                }
                else {
                  pcVar11 = 
                  "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n"
                  ;
                }
              }
              else {
                iVar6 = argc - globalUtilOptind;
                if (iVar6 < 3) {
                  if (iVar6 == 2) {
                    local_48[0] = argv[globalUtilOptind];
                    local_48[1] = (argv + globalUtilOptind)[1];
                    lVar10 = 0;
                    break;
                  }
                  pGVar9 = pAbc->pGia;
                  if (pGVar9 == (Gia_Man_t *)0x0) {
                    pcVar11 = "Abc_CommandAbc9Cec(): There is no current AIG.\n";
                  }
                  else {
                    pGias[0] = pGVar9;
                    if (iVar6 == 1) {
                      pcVar11 = argv[globalUtilOptind];
                      pcVar7 = pcVar11;
                      goto LAB_0024f44d;
                    }
                    if (argc != globalUtilOptind) {
                      __assert_fail("nArgcNew == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                                    ,0x9091,"int Abc_CommandAbc9Cec(Abc_Frame_t *, int, char **)");
                    }
                    pcVar11 = pGVar9->pSpec;
                    pcVar7 = pcVar11;
                    if (pcVar11 != (char *)0x0) goto LAB_0024f44d;
                    pcVar11 = "File name is not given on the command line.\n";
                  }
                }
                else {
                  pcVar11 = "Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n";
                }
              }
              iVar6 = -1;
              goto LAB_0024f21a;
            }
            goto switchD_0024f04a_caseD_6f;
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
        goto LAB_0024f013;
      }
      if (argc <= globalUtilOptind) {
        pcVar11 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0024f0fb;
      }
      iVar5 = atoi(argv[globalUtilOptind]);
      ParsCec.TimeLimit = iVar5;
    }
    globalUtilOptind = iVar6 + 1;
    if (iVar5 < 0) {
switchD_0024f04a_caseD_6f:
      iVar6 = -2;
      Abc_Print(-2,"usage: &cec [-CT num] [-nmdasvh]\n");
      Abc_Print(-2,"\t         new combinational equivalence checker\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)ParsCec.nBTLimit);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)ParsCec.TimeLimit);
      pcVar7 = "yes";
      pcVar11 = "yes";
      if (ParsCec.fNaive == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar11);
      pcVar11 = "miter";
      if (!bVar2) {
        pcVar11 = "two circuits";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (!bVar3) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (!bVar4) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle writing dual-output miter [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (ParsCec.fSilent == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle silent operation [default = %s]\n",pcVar11);
      if (ParsCec.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar7);
      pcVar11 = "\t-h     : print the command usage\n";
LAB_0024f21a:
      Abc_Print(iVar6,pcVar11);
      return 1;
    }
  } while( true );
LAB_0024f2bc:
  pGVar9 = pGias[0];
  if (lVar10 != 2) {
    pcVar11 = local_48[lVar10];
    pcVar7 = pcVar11;
    do {
      if (*pcVar7 == '>') {
        *pcVar7 = '\\';
      }
      else if (*pcVar7 == '\0') goto LAB_0024f2e4;
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  goto LAB_0024f4a4;
LAB_0024f2e4:
  pFVar8 = fopen(pcVar11,"r");
  if (pFVar8 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar11);
    pcVar11 = Extra_FileGetSimilarName
                        (pcVar11,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    local_48[lVar10] = pcVar11;
    goto LAB_0024f571;
  }
  fclose(pFVar8);
  pGVar9 = Gia_AigerRead(pcVar11,0,0,0);
  pGias[lVar10] = pGVar9;
  lVar10 = lVar10 + 1;
  if (pGVar9 == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"Reading AIGER from file \"%s\" has failed.\n",pcVar11);
    return 0;
  }
  goto LAB_0024f2bc;
LAB_0024f44d:
  if (*pcVar11 == '>') {
    *pcVar11 = '\\';
  }
  else if (*pcVar11 == '\0') {
    pFVar8 = fopen(pcVar7,"r");
    if (pFVar8 == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar7);
      pcVar11 = Extra_FileGetSimilarName
                          (pcVar7,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0024f571:
      if (pcVar11 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar11);
      }
      pcVar11 = "\n";
      iVar5 = 1;
      iVar6 = iVar5;
    }
    else {
      fclose(pFVar8);
      iVar6 = 0;
      pGias[1] = Gia_AigerRead(pcVar7,0,0,0);
      if (pGias[1] != (Gia_Man_t *)0x0) {
LAB_0024f4a4:
        p = pGias[1];
        pInit = Gia_ManMiter(pGVar9,pGias[1],0,1,0,0,ParsCec.fVerbose);
        if (pInit != (Gia_Man_t *)0x0) {
          if (bVar4) {
            Abc_Print(0,"The verification miter is written into file \"%s\".\n","cec_miter.aig");
            Gia_AigerWrite(pInit,"cec_miter.aig",0,0,0);
          }
          iVar6 = Cec_ManVerify(pInit,&ParsCec);
          pAbc->Status = iVar6;
          Abc_FrameReplaceCex(pAbc,&pGVar9->pCexComb);
          Gia_ManStop(pInit);
        }
        if (pGVar9 != pAbc->pGia) {
          Gia_ManStop(pGVar9);
        }
        Gia_ManStop(p);
        return 0;
      }
      pcVar11 = "Reading AIGER has failed.\n";
      iVar5 = -1;
      pGias[1] = (Gia_Man_t *)0x0;
    }
    Abc_Print(iVar5,pcVar11);
    return iVar6;
  }
  pcVar11 = pcVar11 + 1;
  goto LAB_0024f44d;
}

Assistant:

int Abc_CommandAbc9Cec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    FILE * pFile;
    Gia_Man_t * pGias[2] = {NULL, NULL}, * pMiter;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fDumpMiter = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdasvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 'a':
            fDumpMiter ^= 1;
            break;
        case 's':
            pPars->fSilent ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( fMiter )
    {
        if ( pAbc->pGia == NULL || nArgcNew != 0 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n" );
            return 1;
        }
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter.\n" );
            pAbc->Status = Cec_ManVerify( pAbc->pGia, pPars );
        }
        else
        {
            Gia_Man_t * pTemp;
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter.\n" );
            pTemp = Gia_ManDemiterToDual( pAbc->pGia );
            pAbc->Status = Cec_ManVerify( pTemp, pPars );
            ABC_SWAP( Abc_Cex_t *, pAbc->pGia->pCexComb, pTemp->pCexComb );
            Gia_ManStop( pTemp );
        }
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        return 0;
    }
    if ( nArgcNew > 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n" );
        return 1;
    }
    if ( nArgcNew == 2 )
    {
        char * pFileNames[2] = { pArgvNew[0], pArgvNew[1] }, * pTemp;
        int n;
        for ( n = 0; n < 2; n++ )
        {
            // fix the wrong symbol
            for ( pTemp = pFileNames[n]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( pFileNames[n], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", pFileNames[n] );
                if ( (pFileNames[n] = Extra_FileGetSimilarName( pFileNames[n], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", pFileNames[n] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[n] = Gia_AigerRead( pFileNames[n], 0, 0, 0 );
            if ( pGias[n] == NULL )
            {
                Abc_Print( -1, "Reading AIGER from file \"%s\" has failed.\n", pFileNames[n] );
                return 0;
            }
        }
    }
    else
    {
        char * FileName, * pTemp;
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): There is no current AIG.\n" );
            return 1;
        }
        pGias[0] = pAbc->pGia;
        if ( nArgcNew == 1 )
            FileName = pArgvNew[0];
        else
        {
            assert( nArgcNew == 0 );
            if ( pAbc->pGia->pSpec == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
            FileName = pAbc->pGia->pSpec;
        }
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGias[1] = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pGias[1] == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    // compute the miter
    pMiter = Gia_ManMiter( pGias[0], pGias[1], 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pMiter );
    }
    if ( pGias[0] != pAbc->pGia )
        Gia_ManStop( pGias[0] );
    Gia_ManStop( pGias[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: &cec [-CT num] [-nmdasvh]\n" );
    Abc_Print( -2, "\t         new combinational equivalence checker\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-a     : toggle writing dual-output miter [default = %s]\n", fDumpMiter? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle silent operation [default = %s]\n", pPars->fSilent ? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}